

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O2

bool __thiscall
UnifiedRegex::MatchChar3Inst::Exec
          (MatchChar3Inst *this,Matcher *matcher,Char *input,CharCount inputLength,
          CharCount *matchStart,CharCount *inputOffset,CharCount *nextSyncInputOffset,
          uint8 **instPointer,ContStack *contStack,AssertionStack *assertionStack,uint *qcTicks,
          bool firstIteration)

{
  uint64 *puVar1;
  Char CVar2;
  uint uVar3;
  bool bVar4;
  
  if (matcher->stats != (Type)0x0) {
    puVar1 = &matcher->stats->numCompares;
    *puVar1 = *puVar1 + 1;
  }
  uVar3 = *inputOffset;
  if ((uVar3 < inputLength) &&
     (((CVar2 = input[uVar3], CVar2 == (this->super_Char3Mixin).cs[0] ||
       (CVar2 == (this->super_Char3Mixin).cs[1])) || (CVar2 == (this->super_Char3Mixin).cs[2])))) {
    *inputOffset = uVar3 + 1;
    *instPointer = *instPointer + 7;
    bVar4 = false;
  }
  else {
    bVar4 = Matcher::Fail(matcher,input,inputOffset,instPointer,contStack,assertionStack,qcTicks);
  }
  return bVar4;
}

Assistant:

inline bool MatchChar3Inst::Exec(REGEX_INST_EXEC_PARAMETERS) const
    {
#if ENABLE_REGEX_CONFIG_OPTIONS
        matcher.CompStats();
#endif
        if (inputOffset >= inputLength || (input[inputOffset] != cs[0] && input[inputOffset] != cs[1] && input[inputOffset] != cs[2]))
        {
            return matcher.Fail(FAIL_PARAMETERS);
        }

        inputOffset++;
        instPointer += sizeof(*this);
        return false;
    }